

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_parameters.cpp
# Opt level: O2

void __thiscall
ArgWrapper<wchar_t>::ArgWrapper
          (ArgWrapper<wchar_t> *this,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *in_args)

{
  pointer pbVar1;
  long lVar2;
  wchar_t **ppwVar3;
  size_t index;
  long lVar4;
  
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::vector(&this->m_args,in_args);
  lVar2 = (long)(in_args->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(in_args->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  ppwVar3 = (wchar_t **)operator_new__(-(ulong)(lVar2 + 1U >> 0x3d != 0) | lVar2 * 8 + 8U);
  (this->m_argv)._M_t.
  super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
  super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
  super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl = ppwVar3;
  lVar2 = 0;
  for (lVar4 = 0;
      pbVar1 = (this->m_args).
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar4 != (long)(this->m_args).
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
      lVar4 = lVar4 + 1) {
    *(undefined8 *)
     ((long)(this->m_argv)._M_t.
            super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
            super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
            super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl + lVar2) =
         *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2 * 4);
    lVar2 = lVar2 + 8;
  }
  *(undefined8 *)
   ((long)(this->m_argv)._M_t.
          super___uniq_ptr_impl<const_wchar_t_*,_std::default_delete<const_wchar_t_*[]>_>._M_t.
          super__Tuple_impl<0UL,_const_wchar_t_**,_std::default_delete<const_wchar_t_*[]>_>.
          super__Head_base<0UL,_const_wchar_t_**,_false>._M_head_impl +
   ((long)(in_args->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish -
    (long)(in_args->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start >> 2)) = 0;
  return;
}

Assistant:

ArgWrapper(std::vector<std::basic_string<CharT>> in_args)
		: m_args{ in_args },
		m_argv{ new const CharT*[in_args.size() + 1] } {
		// Populate m_argv
		for (size_t index = 0; index != m_args.size(); ++index) {
			m_argv[index] = m_args[index].c_str();
		}
		m_argv[in_args.size()] = nullptr; // last arg is always nullptr
	}